

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void features::Sift::load_lowe_descriptors(string *filename,Descriptors *result)

{
  byte bVar1;
  char *pcVar2;
  runtime_error *prVar3;
  void *pvVar4;
  float *pfVar5;
  int local_44c;
  undefined1 local_448 [4];
  int j;
  Descriptor descriptor;
  int i;
  int num_dimensions;
  int num_descriptors;
  undefined1 local_220 [8];
  ifstream in;
  Descriptors *result_local;
  string *filename_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Cannot open descriptor file");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = (void *)std::istream::operator>>(local_220,&i);
  std::istream::operator>>(pvVar4,(int *)(descriptor.data.v + 0x7f));
  if ((i < 0x186a1) && (descriptor.data.v[0x7f] == 1.79366e-43)) {
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::clear
              (result);
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::reserve
              (result,(long)i);
    for (descriptor.data.v[0x7e] = 0.0; (int)descriptor.data.v[0x7e] < i;
        descriptor.data.v[0x7e] = (float)((int)descriptor.data.v[0x7e] + 1)) {
      Descriptor::Descriptor((Descriptor *)local_448);
      pvVar4 = (void *)std::istream::operator>>(local_220,(float *)&j);
      pvVar4 = (void *)std::istream::operator>>(pvVar4,(float *)local_448);
      pvVar4 = (void *)std::istream::operator>>(pvVar4,&descriptor.x);
      std::istream::operator>>(pvVar4,&descriptor.y);
      for (local_44c = 0; local_44c < 0x80; local_44c = local_44c + 1) {
        pfVar5 = math::Vector<float,_128>::operator[]
                           ((Vector<float,_128> *)&descriptor.scale,local_44c);
        std::istream::operator>>(local_220,pfVar5);
      }
      math::Vector<float,_128>::normalize((Vector<float,_128> *)&descriptor.scale);
      std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
      push_back(result,(value_type *)local_448);
    }
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::clear
                (result);
      std::ifstream::close();
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Error while reading descriptors");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_220);
    return;
  }
  std::ifstream::close();
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Invalid number of descriptors/dimensions");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Sift::load_lowe_descriptors (std::string const& filename, Descriptors* result)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw std::runtime_error("Cannot open descriptor file");

    int num_descriptors;
    int num_dimensions;
    in >> num_descriptors >> num_dimensions;
    if (num_descriptors > 100000 || num_dimensions != 128)
    {
        in.close();
        throw std::runtime_error("Invalid number of descriptors/dimensions");
    }
    result->clear();
    result->reserve(num_descriptors);
    for (int i = 0; i < num_descriptors; ++i)
    {
        Sift::Descriptor descriptor;
        in >> descriptor.y >> descriptor.x
            >> descriptor.scale >> descriptor.orientation;
        for (int j = 0; j < 128; ++j)
            in >> descriptor.data[j];
        descriptor.data.normalize();
        result->push_back(descriptor);
    }

    if (!in.good())
    {
        result->clear();
        in.close();
        throw std::runtime_error("Error while reading descriptors");
    }

    in.close();
}